

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

unique_ptr<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_> __thiscall
perfetto::internal::SystemTracingBackend::ConnectProducer
          (SystemTracingBackend *this,ConnectProducerArgs *args)

{
  uint uVar1;
  uint uVar2;
  Producer *producer;
  TaskRunner *task_runner;
  code *pcVar3;
  bool bVar4;
  char *pcVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  string *in_RDX;
  unique_ptr<perfetto::SharedMemoryArbiter,_std::default_delete<perfetto::SharedMemoryArbiter>_>
  local_40;
  unique_ptr<perfetto::SharedMemory,_std::default_delete<perfetto::SharedMemory>_> local_38;
  undefined1 local_29;
  string *local_28;
  ConnectProducerArgs *args_local;
  SystemTracingBackend *this_local;
  unique_ptr<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_> *endpoint
  ;
  
  local_29 = 0;
  local_28 = in_RDX;
  args_local = args;
  this_local = this;
  pcVar5 = GetProducerSocket();
  producer = *(Producer **)(local_28 + 1);
  task_runner = (TaskRunner *)local_28[1]._M_string_length;
  uVar1 = *(uint *)&local_28[1].field_2;
  uVar2 = *(uint *)((long)&local_28[1].field_2 + 4);
  ::std::unique_ptr<perfetto::SharedMemory,std::default_delete<perfetto::SharedMemory>>::
  unique_ptr<std::default_delete<perfetto::SharedMemory>,void>
            ((unique_ptr<perfetto::SharedMemory,std::default_delete<perfetto::SharedMemory>> *)
             &local_38,(nullptr_t)0x0);
  ::std::
  unique_ptr<perfetto::SharedMemoryArbiter,std::default_delete<perfetto::SharedMemoryArbiter>>::
  unique_ptr<std::default_delete<perfetto::SharedMemoryArbiter>,void>
            ((unique_ptr<perfetto::SharedMemoryArbiter,std::default_delete<perfetto::SharedMemoryArbiter>>
              *)&local_40,(nullptr_t)0x0);
  ProducerIPCClient::Connect
            ((ProducerIPCClient *)this,pcVar5,producer,local_28,task_runner,kEnabled,(ulong)uVar1,
             (ulong)uVar2,&local_38,&local_40,kRetryIfUnreachable);
  std::
  unique_ptr<perfetto::SharedMemoryArbiter,_std::default_delete<perfetto::SharedMemoryArbiter>_>::
  ~unique_ptr(&local_40);
  std::unique_ptr<perfetto::SharedMemory,_std::default_delete<perfetto::SharedMemory>_>::~unique_ptr
            (&local_38);
  bVar4 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    pcVar5 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    perfetto::base::LogMessage
              (kLogError,pcVar5,0x1244f,"%s (errno: %d, %s)","PERFETTO_CHECK(endpoint)",(ulong)uVar1
               ,pcVar8);
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  return (__uniq_ptr_data<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>,_true,_true>
          )(__uniq_ptr_data<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ProducerEndpoint> SystemTracingBackend::ConnectProducer(
    const ConnectProducerArgs& args) {
  PERFETTO_DCHECK(args.task_runner->RunsTasksOnCurrentThread());

  auto endpoint = ProducerIPCClient::Connect(
      GetProducerSocket(), args.producer, args.producer_name, args.task_runner,
      TracingService::ProducerSMBScrapingMode::kEnabled,
      args.shmem_size_hint_bytes, args.shmem_page_size_hint_bytes, nullptr,
      nullptr, ProducerIPCClient::ConnectionFlags::kRetryIfUnreachable);
  PERFETTO_CHECK(endpoint);
  return endpoint;
}